

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int fmt::v8::detail::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  uVar7 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = (int)uVar7;
  iVar6 = lhs->exp_ + iVar4;
  uVar1 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  uVar5 = (ulong)uVar1;
  iVar8 = rhs->exp_ + uVar1;
  if (iVar6 == iVar8) {
    uVar7 = uVar7 & 0xffffffff;
    iVar4 = iVar4 - uVar1;
    iVar6 = 0;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    while( true ) {
      iVar8 = (int)uVar7;
      iVar4 = (int)uVar5;
      if (iVar8 <= iVar6) break;
      uVar5 = (ulong)(iVar4 - 1);
      uVar2 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar7 - 1];
      uVar7 = uVar7 - 1;
      uVar1 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
      if (uVar2 != uVar1) {
        return ((uVar1 < uVar2) - 1) + (uint)(uVar1 < uVar2);
      }
    }
    if (iVar4 == iVar8) {
      return 0;
    }
    bVar3 = iVar4 < iVar8;
  }
  else {
    bVar3 = iVar8 < iVar6;
  }
  return (uint)bVar3 * 2 + -1;
}

Assistant:

constexpr auto size() const FMT_NOEXCEPT -> size_t { return size_; }